

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_eigensolver.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ostream *poVar1;
  long *plVar2;
  PointerType ptr;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bearingVectors_t bearingVectors2;
  bearingVectors_t bearingVectors1;
  vector<int,_std::allocator<int>_> camCorrespondences2;
  vector<int,_std::allocator<int>_> camCorrespondences1;
  MatrixXd gt;
  rotations_t camRotations;
  translations_t camOffsets;
  translation_t position1;
  translation_t position;
  translation_t position2;
  rotation_t rotation1;
  undefined1 local_2f8 [120];
  double local_280;
  double dStack_278;
  double local_270;
  double local_268;
  double dStack_260;
  double local_258;
  double local_250;
  double dStack_248;
  double local_240;
  rotation_t local_230;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  rotation_t rotation;
  rotation_t eigensolver_rotation;
  rotation_t R_perturbed;
  translation_t t_perturbed;
  rotation_t rotation2;
  CentralRelativeAdapter adapter;
  
  opengv::initializeRandomSeed();
  position1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  position1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  position1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       1.0;
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       1.0;
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       0.0;
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       1.0;
  opengv::generateRandomDirectionTranslation(&position2,0.0005);
  opengv::generateRandomRotation(&rotation2,0.5);
  camOffsets.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  camOffsets.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  camOffsets.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  camRotations.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  camRotations.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  camRotations.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  opengv::generateCentralCameraSystem(&camOffsets,&camRotations);
  bearingVectors1.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bearingVectors1.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bearingVectors1.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bearingVectors2.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bearingVectors2.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bearingVectors2.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  camCorrespondences1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  camCorrespondences1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  camCorrespondences1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  camCorrespondences2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  camCorrespondences2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  camCorrespondences2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  gt.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  gt.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  gt.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)&gt,0x1e,3,10);
  opengv::generateRandom2D2DCorrespondences
            (&position1,&rotation1,&position2,&rotation2,&camOffsets,&camRotations,10,0.5,0.0,
             &bearingVectors1,&bearingVectors2,&camCorrespondences1,&camCorrespondences2,&gt);
  opengv::extractRelativePose(&position1,&position2,&rotation1,&rotation2,&position,&rotation,true);
  opengv::printExperimentCharacteristics(&position,&rotation,0.5,0.0);
  opengv::relative_pose::CentralRelativeAdapter::CentralRelativeAdapter
            (&adapter,&bearingVectors1,&bearingVectors2,&rotation);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"running eigensolver with perturbed rotation",0x2b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  opengv::getPerturbedPose(&position,&rotation,&t_perturbed,&R_perturbed,0.01);
  adapter.super_RelativeAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       R_perturbed.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
       array[0];
  adapter.super_RelativeAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       R_perturbed.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
       array[1];
  adapter.super_RelativeAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       R_perturbed.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
       array[2];
  adapter.super_RelativeAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       R_perturbed.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
       array[3];
  adapter.super_RelativeAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       R_perturbed.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
       array[4];
  adapter.super_RelativeAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       R_perturbed.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
       array[5];
  adapter.super_RelativeAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       R_perturbed.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
       array[6];
  adapter.super_RelativeAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       R_perturbed.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
       array[7];
  adapter.super_RelativeAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       R_perturbed.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
       array[8];
  local_2f8._88_8_ =
       R_perturbed.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
       array[8];
  local_2f8._24_8_ =
       R_perturbed.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
       array[0];
  local_2f8._32_8_ =
       R_perturbed.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
       array[1];
  local_2f8._40_8_ =
       R_perturbed.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
       array[2];
  local_2f8._48_8_ =
       R_perturbed.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
       array[3];
  local_2f8._56_8_ =
       R_perturbed.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
       array[4];
  local_2f8._64_8_ =
       R_perturbed.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
       array[5];
  local_2f8._72_8_ =
       R_perturbed.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
       array[6];
  local_2f8._80_8_ =
       R_perturbed.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
       array[7];
  opengv::relative_pose::eigensolver
            (&local_230,&adapter.super_RelativeAdapterBase,(eigensolverOutput_t *)local_2f8,false);
  eigensolver_rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
  .array[8] = local_230.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[8];
  eigensolver_rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
  .array[0] = local_230.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[0];
  eigensolver_rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
  .array[1] = local_230.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[1];
  eigensolver_rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
  .array[2] = local_230.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[2];
  eigensolver_rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
  .array[3] = local_230.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[3];
  eigensolver_rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
  .array[4] = local_230.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[4];
  eigensolver_rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
  .array[5] = local_230.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5];
  eigensolver_rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
  .array[6] = local_230.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[6];
  eigensolver_rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
  .array[7] = local_230.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[7];
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"results from eigensystem based rotation solver:",0x2f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                             &eigensolver_rotation);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"the eigenvectors are: ",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_280);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"the eigenvalues are: ",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)(local_2f8 + 0x60))
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"the norms of the eigenvectors are: ",0x23);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_270 * local_270 + local_280 * local_280 + dStack_278 * dStack_278;
  auVar3 = vsqrtsd_avx(auVar3,auVar3);
  poVar1 = std::ostream::_M_insert<double>(auVar3._0_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_258 * local_258 + local_268 * local_268 + dStack_260 * dStack_260;
  auVar3 = vsqrtsd_avx(auVar4,auVar4);
  poVar1 = std::ostream::_M_insert<double>(auVar3._0_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_240 * local_240 + local_250 * local_250 + dStack_248 * dStack_248;
  auVar3 = vsqrtsd_avx(auVar5,auVar5);
  poVar1 = std::ostream::_M_insert<double>(auVar3._0_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"the orthogongality is: ",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  local_230.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_230.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  local_230.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       1.48219693752374e-323;
  local_1e8 = 0;
  local_1e0 = 1;
  local_1d8 = 3;
  local_230.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_280;
  local_230.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       (double)&local_280;
  local_230.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       (double)&local_268;
  local_230.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       (double)&local_280;
  Eigen::operator<<((ostream *)&std::cout,
                    (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>_>
                     *)&local_230);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  local_230.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_230.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  local_230.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       1.48219693752374e-323;
  local_1e8 = 0;
  local_1e0 = 2;
  local_1d8 = 3;
  local_230.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_280;
  local_230.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       (double)&local_280;
  local_230.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       (double)&local_250;
  local_230.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       (double)&local_280;
  Eigen::operator<<((ostream *)&std::cout,
                    (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>_>
                     *)&local_230);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  local_230.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_230.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       4.94065645841247e-324;
  local_230.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       1.48219693752374e-323;
  local_1e8 = 0;
  local_1e0 = 2;
  local_1d8 = 3;
  local_230.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_268;
  local_230.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       (double)&local_280;
  local_230.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       (double)&local_250;
  local_230.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       (double)&local_280;
  Eigen::operator<<((ostream *)&std::cout,
                    (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>_>
                     *)&local_230);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"the norm of the translation is: ",0x20);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (double)local_2f8._16_8_ * (double)local_2f8._16_8_ +
                 (double)local_2f8._0_8_ * (double)local_2f8._0_8_ +
                 (double)local_2f8._8_8_ * (double)local_2f8._8_8_;
  auVar3 = vsqrtsd_avx(auVar6,auVar6);
  poVar1 = std::ostream::_M_insert<double>(auVar3._0_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  opengv::relative_pose::CentralRelativeAdapter::~CentralRelativeAdapter(&adapter);
  if (gt.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)gt.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_data[-1]);
  }
  if (camCorrespondences2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(camCorrespondences2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (camCorrespondences1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(camCorrespondences1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (bearingVectors2.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)bearingVectors2.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [2]);
  }
  if (bearingVectors1.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)bearingVectors1.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [2]);
  }
  if (camRotations.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)camRotations.
                 super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                 [8]);
  }
  if (camOffsets.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)camOffsets.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [2]);
  }
  return 0;
}

Assistant:

int main( int argc, char** argv )
{
  // initialize random seed
  initializeRandomSeed();

  //set experiment parameters
  double noise = 0.5;
  double outlierFraction = 0.0;
  size_t numberPoints = 10;

  //generate a random pose for viewpoint 1
  translation_t position1 = Eigen::Vector3d::Zero();
  rotation_t rotation1 = Eigen::Matrix3d::Identity();

  //generate a random pose for viewpoint 2
  translation_t position2 = generateRandomDirectionTranslation(0.0005);
  rotation_t rotation2 = generateRandomRotation(0.5);

  //create a fake central camera
  translations_t camOffsets;
  rotations_t camRotations;
  generateCentralCameraSystem( camOffsets, camRotations );

  //derive correspondences based on random point-cloud
  bearingVectors_t bearingVectors1;
  bearingVectors_t bearingVectors2;
  std::vector<int> camCorrespondences1; //unused in the central case
  std::vector<int> camCorrespondences2; //unused in the central case
  Eigen::MatrixXd gt(3,numberPoints);
  generateRandom2D2DCorrespondences(
      position1, rotation1, position2, rotation2,
      camOffsets, camRotations, numberPoints, noise, outlierFraction,
      bearingVectors1, bearingVectors2,
      camCorrespondences1, camCorrespondences2, gt );

  //Extract the relative pose
  translation_t position; rotation_t rotation;
  extractRelativePose(
      position1, position2, rotation1, rotation2, position, rotation );

  //print experiment characteristics
  printExperimentCharacteristics( position, rotation, noise, outlierFraction );

  //create a central relative adapter
  relative_pose::CentralRelativeAdapter adapter(
      bearingVectors1,
      bearingVectors2,
      rotation);

  //run experiments
  std::cout << "running eigensolver with perturbed rotation" << std::endl;
  translation_t t_perturbed; rotation_t R_perturbed;
  getPerturbedPose( position, rotation, t_perturbed, R_perturbed, 0.01);
  adapter.setR12(R_perturbed);
  rotation_t eigensolver_rotation;
  eigensolverOutput_t output;
  output.rotation = adapter.getR12(); //transferring the initial value
  eigensolver_rotation = relative_pose::eigensolver(adapter,output);

  //print results
  std::cout << "results from eigensystem based rotation solver:" << std::endl;
  std::cout << eigensolver_rotation << std::endl << std::endl;
  std::cout << "the eigenvectors are: " << std::endl;
  std::cout << output.eigenvectors << std::endl << std::endl;
  std::cout << "the eigenvalues are: " << std::endl;
  std::cout << output.eigenvalues << std::endl << std::endl;
  std::cout << "the norms of the eigenvectors are: " << std::endl;
  std::cout << output.eigenvectors.col(0).norm() << " ";
  std::cout << output.eigenvectors.col(1).norm() << " ";
  std::cout << output.eigenvectors.col(2).norm() << std::endl << std::endl;
  std::cout << "the orthogongality is: " << std::endl;
  std::cout << output.eigenvectors.col(0).transpose()*output.eigenvectors.col(1);
  std::cout << " ";
  std::cout << output.eigenvectors.col(0).transpose()*output.eigenvectors.col(2);
  std::cout << " ";
  std::cout << output.eigenvectors.col(1).transpose()*output.eigenvectors.col(2);
  std::cout << std::endl << std::endl;
  std::cout << "the norm of the translation is: " << std::endl;
  std::cout << output.translation.norm() << std::endl;

}